

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int vm_builtin_gettype(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *local_28;
  char *zType;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  local_28 = "null";
  if (0 < nArg) {
    local_28 = jx9MemObjTypeDump(*apArg);
  }
  jx9_result_string(pCtx,local_28,-1);
  return 0;
}

Assistant:

static int vm_builtin_gettype(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zType = "null";
	if( nArg > 0 ){
		zType = jx9MemObjTypeDump(apArg[0]);
	}
	/* Return the variable type */
	jx9_result_string(pCtx, zType, -1/*Compute length automatically*/);
	return SXRET_OK;
}